

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O0

int I010ToAR30Matrix(uint16_t *src_y,int src_stride_y,uint16_t *src_u,int src_stride_u,
                    uint16_t *src_v,int src_stride_v,uint8_t *dst_ar30,int dst_stride_ar30,
                    YuvConstants *yuvconstants,int width,int height)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  _func_void_uint16_t_ptr_uint16_t_ptr_uint16_t_ptr_uint8_t_ptr_YuvConstants_ptr_int *I210ToAR30Row;
  int y;
  uint in_stack_00000020;
  code *pcVar2;
  uint local_38;
  long local_30;
  long local_20;
  long local_10;
  int local_4;
  
  pcVar2 = I210ToAR30Row_C;
  if (((((in_RDI == 0) || (in_RDX == 0)) || (in_R8 == 0)) ||
      ((I210ToAR30Row ==
        (_func_void_uint16_t_ptr_uint16_t_ptr_uint16_t_ptr_uint8_t_ptr_YuvConstants_ptr_int *)0x0 ||
       ((int)in_stack_00000020 < 1)))) || ((int)src_u == 0)) {
    local_4 = -1;
  }
  else {
    if ((int)src_u < 0) {
      src_u._0_4_ = -(int)src_u;
      I210ToAR30Row = I210ToAR30Row + ((int)src_u + -1) * y;
      y = -y;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if ((iVar1 != 0) && (pcVar2 = I210ToAR30Row_Any_SSSE3, (in_stack_00000020 & 7) == 0)) {
      pcVar2 = I210ToAR30Row_SSSE3;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if ((iVar1 != 0) && (pcVar2 = I210ToAR30Row_Any_AVX2, (in_stack_00000020 & 0xf) == 0)) {
      pcVar2 = I210ToAR30Row_AVX2;
    }
    local_30 = in_R8;
    local_20 = in_RDX;
    local_10 = in_RDI;
    for (local_38 = 0; (int)local_38 < (int)src_u; local_38 = local_38 + 1) {
      (*pcVar2)(local_10,local_20,local_30,I210ToAR30Row,src_v,in_stack_00000020);
      I210ToAR30Row = I210ToAR30Row + y;
      local_10 = local_10 + (long)in_ESI * 2;
      if ((local_38 & 1) != 0) {
        local_20 = local_20 + (long)in_ECX * 2;
        local_30 = local_30 + (long)in_R9D * 2;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int I010ToAR30Matrix(const uint16_t* src_y,
                     int src_stride_y,
                     const uint16_t* src_u,
                     int src_stride_u,
                     const uint16_t* src_v,
                     int src_stride_v,
                     uint8_t* dst_ar30,
                     int dst_stride_ar30,
                     const struct YuvConstants* yuvconstants,
                     int width,
                     int height) {
  int y;
  void (*I210ToAR30Row)(const uint16_t* y_buf, const uint16_t* u_buf,
                        const uint16_t* v_buf, uint8_t* rgb_buf,
                        const struct YuvConstants* yuvconstants, int width) =
      I210ToAR30Row_C;
  if (!src_y || !src_u || !src_v || !dst_ar30 || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_ar30 = dst_ar30 + (height - 1) * dst_stride_ar30;
    dst_stride_ar30 = -dst_stride_ar30;
  }
#if defined(HAS_I210TOAR30ROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    I210ToAR30Row = I210ToAR30Row_Any_SSSE3;
    if (IS_ALIGNED(width, 8)) {
      I210ToAR30Row = I210ToAR30Row_SSSE3;
    }
  }
#endif
#if defined(HAS_I210TOAR30ROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    I210ToAR30Row = I210ToAR30Row_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      I210ToAR30Row = I210ToAR30Row_AVX2;
    }
  }
#endif
  for (y = 0; y < height; ++y) {
    I210ToAR30Row(src_y, src_u, src_v, dst_ar30, yuvconstants, width);
    dst_ar30 += dst_stride_ar30;
    src_y += src_stride_y;
    if (y & 1) {
      src_u += src_stride_u;
      src_v += src_stride_v;
    }
  }
  return 0;
}